

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SGXMLScanner::resolveSchemaGrammar
          (SGXMLScanner *this,XMLCh *loc,XMLCh *uri,bool ignoreLoadSchema)

{
  XMLEntityHandler *pXVar1;
  XMLStringPool *pXVar2;
  XMLValidator *pXVar3;
  undefined8 baseURL;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  XMLBuffer *this_00;
  XMLCh *pXVar9;
  undefined4 extraout_var_00;
  MalformedURLException *pMVar10;
  DOMDocument *pDVar11;
  DOMElement *schemaRoot;
  XMLCh *str1;
  undefined4 extraout_var_03;
  long *plVar12;
  SchemaInfo *this_01;
  PSVIHandler *pPVar13;
  XSModel *pXVar14;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *local_7c0;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *local_7b8;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *local_7a8;
  uint local_74c;
  uint local_6f0;
  undefined1 local_618 [8];
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> i;
  TraverseSchema traverseSchema;
  XMLSchemaDescription *gramDesc;
  SchemaGrammar *schemaGrammar;
  bool grammarFound;
  uint newUriId;
  bool newGrammar;
  XMLCh *newUri;
  DOMElement *root;
  DOMDocument *document;
  SchemaInfo *pSStack_368;
  bool flag;
  SchemaInfo *importSchemaInfo;
  uint uriId;
  XMLCh *sysId;
  Janitor<xercesc_4_0::InputSource> janSrc;
  XMLBuffer *resolvedSysId;
  XMLBufBid ddSys;
  XMLURL urlTmp;
  LastExtEntityInfo lastInfo_1;
  undefined1 local_2b0 [8];
  XMLResourceIdentifier resourceIdentifier;
  LastExtEntityInfo lastInfo;
  InputSource *srcToFill;
  XMLBuffer *expSysId;
  XMLBufBid bbSys;
  XMLCh *normalizedURI;
  XMLBuffer *local_230;
  XMLBuffer *normalizedSysId;
  XMLBufBid nnSys;
  XSDDOMParser parser;
  undefined1 local_90 [8];
  XMLSchemaDescriptionImpl theSchemaDescription;
  Grammar *grammar;
  bool ignoreLoadSchema_local;
  XMLCh *uri_local;
  XMLCh *loc_local;
  SGXMLScanner *this_local;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  theSchemaDescription.fAttributes = (XMLAttDef *)0x0;
  XMLSchemaDescriptionImpl::XMLSchemaDescriptionImpl
            ((XMLSchemaDescriptionImpl *)local_90,uri,(this->super_XMLScanner).fMemoryManager);
  XMLSchemaDescriptionImpl::setLocationHints((XMLSchemaDescriptionImpl *)local_90,loc);
  theSchemaDescription.fAttributes =
       (XMLAttDef *)
       GrammarResolver::getGrammar
                 ((this->super_XMLScanner).fGrammarResolver,(XMLGrammarDescription *)local_90);
  XMLSchemaDescriptionImpl::~XMLSchemaDescriptionImpl((XMLSchemaDescriptionImpl *)local_90);
  if ((theSchemaDescription.fAttributes != (XMLAttDef *)0x0) &&
     (iVar7 = (*((theSchemaDescription.fAttributes)->super_XSerializable)._vptr_XSerializable[5])(),
     iVar7 != 0)) {
    bVar4 = XMLScanner::getHandleMultipleImports(&this->super_XMLScanner);
    if (bVar4) {
      iVar7 = (*((theSchemaDescription.fAttributes)->super_XSerializable)._vptr_XSerializable[0x16])
                        ();
      iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x38))();
      if (iVar7 == 2) goto LAB_0036c07c;
    }
    if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
       (((this->super_XMLScanner).fValidate & 1U) == 0)) {
      (this->super_XMLScanner).fValidate = true;
      ElemStack::setValidationFlag
                (&(this->super_XMLScanner).fElemStack,(bool)((this->super_XMLScanner).fValidate & 1)
                );
    }
    if (this->fGrammarType == DTDGrammarType) {
      (this->super_XMLScanner).fGrammar = (Grammar *)theSchemaDescription.fAttributes;
      this->fGrammarType = SchemaGrammarType;
      pXVar3 = (this->super_XMLScanner).fValidator;
      (*pXVar3->_vptr_XMLValidator[0xb])(pXVar3,(this->super_XMLScanner).fGrammar);
    }
    goto LAB_0036d222;
  }
LAB_0036c07c:
  if ((((this->super_XMLScanner).fLoadSchema & 1U) == 0) && (!ignoreLoadSchema)) goto LAB_0036d222;
  XSDDOMParser::XSDDOMParser
            ((XSDDOMParser *)&nnSys.fMgr,(XMLValidator *)0x0,(this->super_XMLScanner).fMemoryManager
             ,(XMLGrammarPool *)0x0);
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)&nnSys.fMgr,Val_Never);
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)&nnSys.fMgr,true);
  XSDDOMParser::setUserEntityHandler
            ((XSDDOMParser *)&nnSys.fMgr,(this->super_XMLScanner).fEntityHandler);
  XSDDOMParser::setUserErrorReporter
            ((XSDDOMParser *)&nnSys.fMgr,(this->super_XMLScanner).fErrorReporter);
  XMLBufBid::XMLBufBid((XMLBufBid *)&normalizedSysId,&(this->super_XMLScanner).fBufMgr);
  local_230 = XMLBufBid::getBuffer((XMLBufBid *)&normalizedSysId);
  normalizedURI._6_2_ = 0xffff;
  XMLString::removeChar(loc,(XMLCh *)((long)&normalizedURI + 6),local_230);
  bbSys.fMgr = (XMLBufferMgr *)XMLBuffer::getRawBuffer(local_230);
  XMLBufBid::XMLBufBid((XMLBufBid *)&expSysId,&(this->super_XMLScanner).fBufMgr);
  this_00 = XMLBufBid::getBuffer((XMLBufBid *)&expSysId);
  lastInfo.colNumber = 0;
  if ((this->super_XMLScanner).fEntityHandler == (XMLEntityHandler *)0x0) {
    XMLBuffer::set(this_00,(XMLCh *)bbSys.fMgr);
  }
  else {
    pXVar1 = (this->super_XMLScanner).fEntityHandler;
    uVar8 = (*pXVar1->_vptr_XMLEntityHandler[3])(pXVar1,bbSys.fMgr,this_00);
    if ((uVar8 & 1) == 0) {
      XMLBuffer::set(this_00,(XMLCh *)bbSys.fMgr);
    }
    ReaderMgr::LastExtEntityInfo::LastExtEntityInfo
              ((LastExtEntityInfo *)&resourceIdentifier.fLocator);
    ReaderMgr::getLastExtEntityInfo
              (&(this->super_XMLScanner).fReaderMgr,
               (LastExtEntityInfo *)&resourceIdentifier.fLocator);
    pXVar9 = XMLBuffer::getRawBuffer(this_00);
    XMLResourceIdentifier::XMLResourceIdentifier
              ((XMLResourceIdentifier *)local_2b0,SchemaGrammar,pXVar9,uri,L"",
               (XMLCh *)resourceIdentifier.fLocator,
               &(this->super_XMLScanner).fReaderMgr.super_Locator);
    pXVar1 = (this->super_XMLScanner).fEntityHandler;
    iVar7 = (*pXVar1->_vptr_XMLEntityHandler[5])(pXVar1,local_2b0);
    lastInfo.colNumber = CONCAT44(extraout_var_00,iVar7);
    XMLResourceIdentifier::~XMLResourceIdentifier((XMLResourceIdentifier *)local_2b0);
  }
  if (lastInfo.colNumber == 0) {
    if (((this->super_XMLScanner).fDisableDefaultEntityResolution & 1U) == 0) {
      ReaderMgr::LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)&urlTmp.fHasInvalidChar);
      ReaderMgr::getLastExtEntityInfo
                (&(this->super_XMLScanner).fReaderMgr,(LastExtEntityInfo *)&urlTmp.fHasInvalidChar);
      XMLURL::XMLURL((XMLURL *)&ddSys.fMgr,(this->super_XMLScanner).fMemoryManager);
      baseURL = urlTmp._80_8_;
      pXVar9 = XMLBuffer::getRawBuffer(this_00);
      bVar4 = XMLURL::setURL((XMLURL *)&ddSys.fMgr,(XMLCh *)baseURL,pXVar9,(XMLURL *)&ddSys.fMgr);
      if ((!bVar4) || (bVar4 = XMLURL::isRelative((XMLURL *)&ddSys.fMgr), bVar4)) {
        if (((this->super_XMLScanner).fStandardUriConformant & 1U) != 0) {
          pMVar10 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar10,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                     ,0xe5b,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(pMVar10,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
        XMLBufBid::XMLBufBid((XMLBufBid *)&resolvedSysId,&(this->super_XMLScanner).fBufMgr);
        janSrc.fData = (InputSource *)XMLBufBid::getBuffer((XMLBufBid *)&resolvedSysId);
        pXVar9 = XMLBuffer::getRawBuffer(this_00);
        XMLUri::normalizeURI(pXVar9,(XMLBuffer *)janSrc.fData);
        lastInfo.colNumber =
             (XMLFileLoc)XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
        pXVar9 = XMLBuffer::getRawBuffer((XMLBuffer *)janSrc.fData);
        LocalFileInputSource::LocalFileInputSource
                  ((LocalFileInputSource *)lastInfo.colNumber,(XMLCh *)urlTmp._80_8_,pXVar9,
                   (this->super_XMLScanner).fMemoryManager);
        XMLBufBid::~XMLBufBid((XMLBufBid *)&resolvedSysId);
      }
      else {
        if ((((this->super_XMLScanner).fStandardUriConformant & 1U) != 0) &&
           (bVar4 = XMLURL::hasInvalidChar((XMLURL *)&ddSys.fMgr), bVar4)) {
          pMVar10 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar10,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                     ,0xe60,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(pMVar10,&MalformedURLException::typeinfo,
                      MalformedURLException::~MalformedURLException);
        }
        lastInfo.colNumber =
             (XMLFileLoc)XMemory::operator_new(0x88,(this->super_XMLScanner).fMemoryManager);
        URLInputSource::URLInputSource
                  ((URLInputSource *)lastInfo.colNumber,(XMLURL *)&ddSys.fMgr,
                   (this->super_XMLScanner).fMemoryManager);
      }
      XMLURL::~XMLURL((XMLURL *)&ddSys.fMgr);
      goto LAB_0036c7e3;
    }
    bVar4 = true;
  }
  else {
LAB_0036c7e3:
    Janitor<xercesc_4_0::InputSource>::Janitor
              ((Janitor<xercesc_4_0::InputSource> *)&sysId,(InputSource *)lastInfo.colNumber);
    pXVar9 = (XMLCh *)(**(code **)(*(long *)lastInfo.colNumber + 0x28))();
    if ((uri == (XMLCh *)0x0) || (*uri == L'\0')) {
      local_6f0 = (this->super_XMLScanner).fEmptyNamespaceId;
    }
    else {
      pXVar2 = (this->super_XMLScanner).fURIStringPool;
      local_6f0 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,uri);
    }
    pSStack_368 = (SchemaInfo *)0x0;
    if (((this->super_XMLScanner).fUseCachedGrammar & 1U) != 0) {
      pSStack_368 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                              (this->fCachedSchemaInfoList,pXVar9,local_6f0);
    }
    if ((pSStack_368 == (SchemaInfo *)0x0) && (((this->super_XMLScanner).fToCacheGrammar & 1U) == 0)
       ) {
      pSStack_368 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                              (this->fSchemaInfoList,pXVar9,local_6f0);
    }
    if (pSStack_368 == (SchemaInfo *)0x0) {
      bVar5 = (**(code **)(*(long *)lastInfo.colNumber + 0x30))();
      (**(code **)(*(long *)lastInfo.colNumber + 0x50))(lastInfo.colNumber,0);
      AbstractDOMParser::parse((AbstractDOMParser *)&nnSys.fMgr,(InputSource *)lastInfo.colNumber);
      (**(code **)(*(long *)lastInfo.colNumber + 0x50))(lastInfo.colNumber,bVar5 & 1);
      bVar4 = XSDDOMParser::getSawFatal((XSDDOMParser *)&nnSys.fMgr);
      if ((bVar4) && (((this->super_XMLScanner).fExitOnFirstFatal & 1U) != 0)) {
        XMLScanner::emitError(&this->super_XMLScanner,SchemaScanFatalError);
      }
      pDVar11 = AbstractDOMParser::getDocument((AbstractDOMParser *)&nnSys.fMgr);
      if (pDVar11 != (DOMDocument *)0x0) {
        iVar7 = (*(pDVar11->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])();
        schemaRoot = (DOMElement *)CONCAT44(extraout_var_01,iVar7);
        if (schemaRoot != (DOMElement *)0x0) {
          iVar7 = (*(schemaRoot->super_DOMNode)._vptr_DOMNode[0x29])
                            (schemaRoot,SchemaSymbols::fgATT_TARGETNAMESPACE);
          str1 = (XMLCh *)CONCAT44(extraout_var_02,iVar7);
          bVar4 = false;
          bVar6 = XMLString::equals(str1,uri);
          if (!bVar6) {
            if ((((this->super_XMLScanner).fValidate & 1U) != 0) ||
               ((this->super_XMLScanner).fValScheme == Val_Auto)) {
              XMLValidator::emitError
                        ((this->super_XMLScanner).fValidator,WrongTargetNamespace,loc,uri,
                         (XMLCh *)0x0,(XMLCh *)0x0);
            }
            theSchemaDescription.fAttributes =
                 (XMLAttDef *)
                 GrammarResolver::getGrammar((this->super_XMLScanner).fGrammarResolver,str1);
            bVar4 = true;
          }
          if ((theSchemaDescription.fAttributes == (XMLAttDef *)0x0) ||
             (iVar7 = (*((theSchemaDescription.fAttributes)->super_XSerializable).
                        _vptr_XSerializable[5])(), iVar7 == 0)) {
LAB_0036cbcb:
            if (bVar4) {
              if ((str1 == (XMLCh *)0x0) || (*str1 == L'\0')) {
                local_74c = (this->super_XMLScanner).fEmptyNamespaceId;
              }
              else {
                pXVar2 = (this->super_XMLScanner).fURIStringPool;
                local_74c = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,str1);
              }
              if (((this->super_XMLScanner).fUseCachedGrammar & 1U) != 0) {
                pSStack_368 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                              ::get(this->fCachedSchemaInfoList,pXVar9,local_74c);
              }
              if ((pSStack_368 == (SchemaInfo *)0x0) &&
                 (((this->super_XMLScanner).fToCacheGrammar & 1U) == 0)) {
                pSStack_368 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                              ::get(this->fSchemaInfoList,pXVar9,local_74c);
              }
              if (pSStack_368 != (SchemaInfo *)0x0) {
                bVar4 = true;
                goto LAB_0036d124;
              }
            }
            if (((this->super_XMLScanner).fValScheme == Val_Auto) &&
               (((this->super_XMLScanner).fValidate & 1U) == 0)) {
              (this->super_XMLScanner).fValidate = true;
              ElemStack::setValidationFlag
                        (&(this->super_XMLScanner).fElemStack,
                         (bool)((this->super_XMLScanner).fValidate & 1));
            }
            bVar4 = false;
            if (theSchemaDescription.fAttributes != (XMLAttDef *)0x0) {
              iVar7 = (*((theSchemaDescription.fAttributes)->super_XSerializable).
                        _vptr_XSerializable[5])();
              bVar4 = iVar7 == 1;
            }
            if (bVar4) {
              gramDesc = (XMLSchemaDescription *)theSchemaDescription.fAttributes;
            }
            else {
              gramDesc = (XMLSchemaDescription *)
                         XMemory::operator_new
                                   (0x98,(this->super_XMLScanner).fGrammarPoolMemoryManager);
              SchemaGrammar::SchemaGrammar
                        ((SchemaGrammar *)gramDesc,
                         (this->super_XMLScanner).fGrammarPoolMemoryManager);
            }
            iVar7 = (*(gramDesc->super_XMLGrammarDescription).super_XSerializable.
                      _vptr_XSerializable[0x16])();
            plVar12 = (long *)CONCAT44(extraout_var_04,iVar7);
            (**(code **)(*plVar12 + 0x68))(plVar12,3);
            (**(code **)(*plVar12 + 0x78))(plVar12,pXVar9);
            if (((this->super_XMLScanner).fUseCachedGrammar & 1U) == 0) {
              local_7a8 = this->fSchemaInfoList;
            }
            else {
              local_7a8 = this->fCachedSchemaInfoList;
            }
            if (((this->super_XMLScanner).fToCacheGrammar & 1U) == 0) {
              local_7b8 = this->fSchemaInfoList;
            }
            else {
              local_7b8 = this->fCachedSchemaInfoList;
            }
            TraverseSchema::TraverseSchema
                      ((TraverseSchema *)&i.fLockPrimaryKey,schemaRoot,
                       (this->super_XMLScanner).fURIStringPool,(SchemaGrammar *)gramDesc,
                       (this->super_XMLScanner).fGrammarResolver,local_7a8,local_7b8,
                       &this->super_XMLScanner,pXVar9,(this->super_XMLScanner).fEntityHandler,
                       (this->super_XMLScanner).fErrorReporter,
                       (this->super_XMLScanner).fMemoryManager,bVar4);
            if (((this->super_XMLScanner).fToCacheGrammar & 1U) == 0) {
              local_7c0 = this->fSchemaInfoList;
            }
            else {
              local_7c0 = this->fCachedSchemaInfoList;
            }
            RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
            RefHash2KeysTableOfEnumerator
                      ((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                        *)local_618,local_7c0,false,XMLPlatformUtils::fgMemoryManager);
            while (bVar4 = RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                           ::hasMoreElements((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                                              *)local_618), bVar4) {
              this_01 = RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                        ::nextElement((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                                       *)local_618);
              SchemaInfo::resetRoot(this_01);
            }
            RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
            ~RefHash2KeysTableOfEnumerator
                      ((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                        *)local_618);
            if (this->fGrammarType == DTDGrammarType) {
              (this->super_XMLScanner).fGrammar = (Grammar *)gramDesc;
              this->fGrammarType = SchemaGrammarType;
              pXVar3 = (this->super_XMLScanner).fValidator;
              (*pXVar3->_vptr_XMLValidator[0xb])(pXVar3,(this->super_XMLScanner).fGrammar);
            }
            if (((this->super_XMLScanner).fValidate & 1U) != 0) {
              pXVar3 = (this->super_XMLScanner).fValidator;
              (*pXVar3->_vptr_XMLValidator[4])(pXVar3,0);
            }
            TraverseSchema::~TraverseSchema((TraverseSchema *)&i.fLockPrimaryKey);
          }
          else {
            bVar6 = XMLScanner::getHandleMultipleImports(&this->super_XMLScanner);
            if (bVar6) {
              iVar7 = (*((theSchemaDescription.fAttributes)->super_XSerializable).
                        _vptr_XSerializable[0x16])();
              iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x38))();
              if (iVar7 == 2) goto LAB_0036cbcb;
            }
          }
        }
      }
      bVar4 = false;
    }
    else {
      bVar4 = true;
    }
LAB_0036d124:
    Janitor<xercesc_4_0::InputSource>::~Janitor((Janitor<xercesc_4_0::InputSource> *)&sysId);
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)&expSysId);
  XMLBufBid::~XMLBufBid((XMLBufBid *)&normalizedSysId);
  XSDDOMParser::~XSDDOMParser((XSDDOMParser *)&nnSys.fMgr);
  if (bVar4) {
    return;
  }
LAB_0036d222:
  pPVar13 = XMLScanner::getPSVIHandler(&this->super_XMLScanner);
  if (pPVar13 != (PSVIHandler *)0x0) {
    pXVar14 = GrammarResolver::getXSModel((this->super_XMLScanner).fGrammarResolver);
    this->fModel = pXVar14;
  }
  return;
}

Assistant:

void SGXMLScanner::resolveSchemaGrammar(const XMLCh* const loc, const XMLCh* const uri, bool ignoreLoadSchema) {

    Grammar* grammar = 0;

    {
        XMLSchemaDescriptionImpl    theSchemaDescription(uri, fMemoryManager);
        theSchemaDescription.setLocationHints(loc);
        grammar = fGrammarResolver->getGrammar(&theSchemaDescription);
    }

    // If multi-import is enabled, make sure the existing grammar came
    // from the import directive. Otherwise we may end up reloading
    // the same schema that came from the external grammar pool. Ideally,
    // we would move fSchemaInfoList to XMLGrammarPool so that it survives
    // the destruction of the scanner in which case we could rely on the
    // same logic we use to weed out duplicate schemas below.
    //
    if (!grammar || grammar->getGrammarType() == Grammar::DTDGrammarType ||
        (getHandleMultipleImports() &&
         ((XMLSchemaDescription*)grammar->getGrammarDescription())->
         getContextType () == XMLSchemaDescription::CONTEXT_IMPORT))
    {
      if (fLoadSchema || ignoreLoadSchema)
      {
        XSDDOMParser parser(0, fMemoryManager, 0);

        parser.setValidationScheme(XercesDOMParser::Val_Never);
        parser.setDoNamespaces(true);
        parser.setUserEntityHandler(fEntityHandler);
        parser.setUserErrorReporter(fErrorReporter);

        //Normalize sysId
        XMLBufBid nnSys(&fBufMgr);
        XMLBuffer& normalizedSysId = nnSys.getBuffer();
        XMLString::removeChar(loc, 0xFFFF, normalizedSysId);
        const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

        // Create a buffer for expanding the system id
        XMLBufBid bbSys(&fBufMgr);
        XMLBuffer& expSysId = bbSys.getBuffer();

        //  Allow the entity handler to expand the system id if they choose
        //  to do so.
        InputSource* srcToFill = 0;
        if (fEntityHandler)
        {
            if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
                expSysId.set(normalizedURI);

            ReaderMgr::LastExtEntityInfo lastInfo;
            fReaderMgr.getLastExtEntityInfo(lastInfo);
            XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::SchemaGrammar,
                            expSysId.getRawBuffer(), uri, XMLUni::fgZeroLenString, lastInfo.systemId,
                            &fReaderMgr);
            srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
        }
        else
        {
            expSysId.set(normalizedURI);
        }

        //  If they didn't create a source via the entity handler, then we
        //  have to create one on our own.
        if (!srcToFill)
        {
            if (fDisableDefaultEntityResolution)
                return;

            ReaderMgr::LastExtEntityInfo lastInfo;
            fReaderMgr.getLastExtEntityInfo(lastInfo);

            XMLURL urlTmp(fMemoryManager);
            if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
                (urlTmp.isRelative()))
            {
                if (!fStandardUriConformant)
                {
                    XMLBufBid  ddSys(&fBufMgr);
                    XMLBuffer& resolvedSysId = ddSys.getBuffer();
                    XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                    srcToFill = new (fMemoryManager) LocalFileInputSource
                    (
                        lastInfo.systemId
                        , resolvedSysId.getRawBuffer()
                        , fMemoryManager
                    );
                }
                else
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            }
            else
            {
                if (fStandardUriConformant && urlTmp.hasInvalidChar())
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);

                srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
            }
        }

        // Put a janitor on the input source
        Janitor<InputSource> janSrc(srcToFill);

        // Check if this exact schema has already been seen.
        //
        const XMLCh* sysId = srcToFill->getSystemId();
        unsigned int uriId = (uri && *uri) ? fURIStringPool->addOrFind(uri) : fEmptyNamespaceId;
        SchemaInfo* importSchemaInfo = 0;

        if (fUseCachedGrammar)
          importSchemaInfo = fCachedSchemaInfoList->get(sysId, uriId);

        if (!importSchemaInfo && !fToCacheGrammar)
          importSchemaInfo = fSchemaInfoList->get(sysId, uriId);

        if (importSchemaInfo)
        {
          // We haven't added any new grammars so it is safe to just
          // return.
          //
          return;
        }

        // Should just issue warning if the schema is not found
        bool flag = srcToFill->getIssueFatalErrorIfNotFound();
        srcToFill->setIssueFatalErrorIfNotFound(false);

        parser.parse(*srcToFill);

        // Reset the InputSource
        srcToFill->setIssueFatalErrorIfNotFound(flag);

        if (parser.getSawFatal() && fExitOnFirstFatal)
            emitError(XMLErrs::SchemaScanFatalError);

        DOMDocument* document = parser.getDocument(); //Our Grammar

        if (document != 0) {

            DOMElement* root = document->getDocumentElement();// This is what we pass to TraverserSchema
            if (root != 0)
            {
                const XMLCh* newUri = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);
                bool newGrammar = false;
                if (!XMLString::equals(newUri, uri)) {
                    if (fValidate || fValScheme == Val_Auto) {
                        fValidator->emitError(XMLValid::WrongTargetNamespace, loc, uri);
                    }

                    grammar = fGrammarResolver->getGrammar(newUri);
                    newGrammar = true;
                }

                if (!grammar ||
                    grammar->getGrammarType() == Grammar::DTDGrammarType ||
                    (getHandleMultipleImports() &&
                     ((XMLSchemaDescription*) grammar->getGrammarDescription())->
                     getContextType () == XMLSchemaDescription::CONTEXT_IMPORT))
                {
                    // If we switched namespace URI, recheck the schema info.
                    //
                    if (newGrammar)
                    {
                      unsigned int newUriId = (newUri && *newUri) ? fURIStringPool->addOrFind(newUri) : fEmptyNamespaceId;

                      if (fUseCachedGrammar)
                        importSchemaInfo = fCachedSchemaInfoList->get(sysId, newUriId);

                      if (!importSchemaInfo && !fToCacheGrammar)
                        importSchemaInfo = fSchemaInfoList->get(sysId, newUriId);

                      if (importSchemaInfo)
                        return;
                    }

                    //  Since we have seen a grammar, set our validation flag
                    //  at this point if the validation scheme is auto
                    if (fValScheme == Val_Auto && !fValidate) {
                        fValidate = true;
                        fElemStack.setValidationFlag(fValidate);
                    }

                    bool grammarFound = grammar &&
                      grammar->getGrammarType() == Grammar::SchemaGrammarType;

                    SchemaGrammar* schemaGrammar;

                    if (grammarFound) {
                      schemaGrammar = (SchemaGrammar*) grammar;
                    }
                    else {
                      schemaGrammar = new (fGrammarPoolMemoryManager) SchemaGrammar(fGrammarPoolMemoryManager);
                    }

                    XMLSchemaDescription* gramDesc = (XMLSchemaDescription*) schemaGrammar->getGrammarDescription();

                    gramDesc->setContextType(XMLSchemaDescription::CONTEXT_PREPARSE);
                    gramDesc->setLocationHints(sysId);

                    TraverseSchema traverseSchema
                    (
                        root
                        , fURIStringPool
                        , schemaGrammar
                        , fGrammarResolver
                        , fUseCachedGrammar ? fCachedSchemaInfoList : fSchemaInfoList
                        , fToCacheGrammar ? fCachedSchemaInfoList : fSchemaInfoList
                        , this
                        , sysId
                        , fEntityHandler
                        , fErrorReporter
                        , fMemoryManager
                        , grammarFound
                    );

                    // Reset the now invalid schema roots in the collected
                    // schema info entries.
                    //
                    {
                      RefHash2KeysTableOfEnumerator<SchemaInfo> i (
                        fToCacheGrammar ? fCachedSchemaInfoList : fSchemaInfoList);

                      while (i.hasMoreElements ())
                        i.nextElement().resetRoot ();
                    }

                    if (fGrammarType == Grammar::DTDGrammarType) {
                        fGrammar = schemaGrammar;
                        fGrammarType = Grammar::SchemaGrammarType;
                        fValidator->setGrammar(fGrammar);
                    }

                    if (fValidate) {
                        //  validate the Schema scan so far
                        fValidator->preContentValidation(false);
                    }
                }
            }
        }
      }
    }
    else
    {
        //  Since we have seen a grammar, set our validation flag
        //  at this point if the validation scheme is auto
        if (fValScheme == Val_Auto && !fValidate) {
            fValidate = true;
            fElemStack.setValidationFlag(fValidate);
        }

        // we have seen a schema, so set up the fValidator as fSchemaValidator
        if (fGrammarType == Grammar::DTDGrammarType) {
            fGrammar = grammar;
            fGrammarType = Grammar::SchemaGrammarType;
            fValidator->setGrammar(fGrammar);
        }
    }
    // update fModel; rely on the grammar resolver to do this
    // efficiently
    if(getPSVIHandler())
        fModel = fGrammarResolver->getXSModel();
}